

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void __thiscall
tchecker::clock_constraints_visitor_t::visit
          (clock_constraints_visitor_t *this,typed_diagonal_clkconstr_expression_t *e)

{
  clock_id_t first_00;
  clock_id_t second_00;
  integer_t value_00;
  binary_operator_t op;
  typed_lvalue_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  integer_t value;
  clock_id_t second;
  clock_id_t first;
  typed_diagonal_clkconstr_expression_t *e_local;
  clock_constraints_visitor_t *this_local;
  
  ptVar1 = typed_diagonal_clkconstr_expression_t::first_clock(e);
  first_00 = clock_id(this,&ptVar1->super_typed_expression_t);
  ptVar1 = typed_diagonal_clkconstr_expression_t::second_clock(e);
  second_00 = clock_id(this,&ptVar1->super_typed_expression_t);
  ptVar2 = typed_diagonal_clkconstr_expression_t::bound(e);
  value_00 = const_evaluate((expression_t *)
                            (&ptVar2->field_0x0 + *(long *)(*(long *)ptVar2 + -0x38)));
  op = binary_expression_t::binary_operator
                 (&(e->super_typed_binary_expression_t).super_binary_expression_t);
  add_constraints(this,first_00,second_00,op,value_00);
  return;
}

Assistant:

virtual void visit(tchecker::typed_diagonal_clkconstr_expression_t const & e)
  {
    try {
      tchecker::clock_id_t first = clock_id(e.first_clock());
      tchecker::clock_id_t second = clock_id(e.second_clock());
      tchecker::integer_t value = tchecker::const_evaluate(e.bound());
      add_constraints(first, second, e.binary_operator(), value);
    }
    catch (...) {
      throw std::runtime_error("Syntax error in diagonal clock constraint: cannot compute clock IDs or constant");
    }
  }